

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void dwpt_sym(wpt_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  int iVar1;
  int iVar2;
  int len_avg;
  int t;
  int l;
  int i;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  int N_local;
  double *inp_local;
  wpt_object wt_local;
  
  iVar1 = wt->wave->lpd_len;
  for (t = 0; t < len_cA; t = t + 1) {
    iVar2 = t * 2 + 1;
    cA[t] = 0.0;
    cD[t] = 0.0;
    for (len_avg = 0; len_avg < iVar1; len_avg = len_avg + 1) {
      if ((iVar2 - len_avg < 0) || (N <= iVar2 - len_avg)) {
        if (iVar2 - len_avg < 0) {
          cA[t] = wt->wave->lpd[len_avg] * inp[(len_avg - iVar2) + -1] + cA[t];
          cD[t] = wt->wave->hpd[len_avg] * inp[(len_avg - iVar2) + -1] + cD[t];
        }
        else if (N <= iVar2 - len_avg) {
          cA[t] = wt->wave->lpd[len_avg] * inp[(N * 2 - iVar2) + len_avg + -1] + cA[t];
          cD[t] = wt->wave->hpd[len_avg] * inp[(N * 2 - iVar2) + len_avg + -1] + cD[t];
        }
      }
      else {
        cA[t] = wt->wave->lpd[len_avg] * inp[iVar2 - len_avg] + cA[t];
        cD[t] = wt->wave->hpd[len_avg] * inp[iVar2 - len_avg] + cD[t];
      }
    }
  }
  return;
}

Assistant:

static void dwpt_sym(wpt_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int i, l, t, len_avg;

	len_avg = wt->wave->lpd_len;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + 1;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= 0 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0) {
				cA[i] += wt->wave->lpd[l] * inp[-t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[-t + l - 1];
			}
			else if ((t - l) >= N) {
				cA[i] += wt->wave->lpd[l] * inp[2 * N - t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[2 * N - t + l - 1];
			}

		}
	}


}